

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShaderGenerator.cpp
# Opt level: O1

void __thiscall
rsg::ShaderGenerator::generate
          (ShaderGenerator *this,ShaderParameters *shaderParams,Shader *shader,
          vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *outputs)

{
  VariableManager *this_00;
  pointer *ppuVar1;
  GeneratorState *pGVar2;
  Scalar SVar3;
  Version VVar4;
  pointer ppVVar5;
  undefined8 *puVar6;
  VariableType *type;
  iterator __position;
  ConstValueRangeAccess value;
  ConstValueRangeAccess value_00;
  ConstValueRangeAccess value_01;
  ConstValueRangeAccess value_02;
  ConstValueRangeAccess value_03;
  ConstValueRangeAccess valueRange_00;
  ConstValueRangeAccess valueRange_01;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer this_01;
  deBool dVar9;
  Variable *pVVar10;
  const_iterator __position_00;
  iterator iVar11;
  Variable *variable_00;
  const_iterator __position_01;
  iterator iVar12;
  ValueEntry *pVVar13;
  ShaderInput *pSVar14;
  DeclarationStatement *this_02;
  TestError *this_03;
  char *name;
  ValueEntry *pVVar15;
  char *pcVar16;
  Scalar *pSVar17;
  _Alloc_hider _Var18;
  int comp;
  Scalar *pSVar19;
  pointer ppVVar20;
  pointer ppSVar21;
  pointer ppVVar22;
  long lVar23;
  GeneratorState *pGVar24;
  int comp_2;
  ValueEntry *b;
  vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> entries;
  ReservedScalars reservedScalars;
  Variable *variable;
  ValueRange valueRange;
  ValueScope globalValueScope;
  PrettyPrinter local_2b8;
  ReservedScalars local_284;
  TokenStream local_280;
  ShaderInput *local_260 [2];
  ShaderInput local_250;
  pointer pSStack_218;
  Scalar *local_210;
  VariableType *local_208;
  Scalar *pSStack_200;
  Scalar *local_1f8;
  VariableType *local_1f0;
  Scalar *pSStack_1e8;
  Scalar *local_1e0;
  undefined1 local_1d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  int local_1b0;
  VariableType *local_1a8;
  pointer pMStack_1a0;
  pointer local_198;
  pointer pMStack_190;
  Scalar *local_188;
  Scalar *local_180;
  Scalar *local_170;
  Scalar *local_168 [33];
  Variable *local_60;
  pointer pSStack_58;
  Scalar *local_50;
  ValueScope local_48;
  
  ValueScope::ValueScope(&local_48);
  GeneratorState::setShader(this->m_state,shaderParams,shader);
  local_284.numScalars = 0;
  if (shader->m_type == TYPE_VERTEX) {
    VariableManager::reserve(this->m_state->m_varManager,&local_284,8);
  }
  this_00 = &this->m_varManager;
  VariableManager::pushVariableScope(this_00,&shader->m_globalScope);
  VariableManager::pushValueScope(this_00,&local_48);
  local_250.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)this_00;
  for (ppSVar21 = (outputs->
                  super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      ppSVar21 !=
      (outputs->super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>)._M_impl
      .super__Vector_impl_data._M_finish; ppSVar21 = ppSVar21 + 1) {
    pSVar14 = *ppSVar21;
    pVVar10 = VariableManager::allocate
                        (this->m_state->m_varManager,&pSVar14->m_variable->m_type,STORAGE_SHADER_OUT
                         ,(pSVar14->m_variable->m_name)._M_dataplus._M_p);
    local_60 = pSVar14->m_variable;
    pSStack_58 = (pSVar14->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    uVar7 = pSVar14->m_variable;
    uVar8 = (pSVar14->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_start;
    value.m_min = (Scalar *)uVar8;
    value.m_type = (VariableType *)uVar7;
    local_50 = (pSVar14->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
               _M_impl.super__Vector_impl_data._M_start;
    value.m_max = local_50;
    VariableManager::setValue(this->m_state->m_varManager,pVVar10,value);
  }
  local_1d8._8_8_ = &local_1c0;
  if (shader->m_type == TYPE_FRAGMENT) {
    local_1d8._0_8_ = (GeneratorState *)0x1;
    local_1d8._16_8_ = (pointer)0x0;
    local_1c0._M_local_buf[0] = '\0';
    local_1b0 = 4;
    local_1a8 = (VariableType *)0x0;
    pMStack_1a0 = (pointer)0x0;
    local_198 = (pointer)0x0;
    pMStack_190 = (pointer)0x0;
    VVar4 = this->m_state->m_programParams->version;
    pcVar16 = "dEQP_FragColor";
    if (VVar4 != VERSION_300) {
      pcVar16 = (char *)0x0;
    }
    name = "gl_FragColor";
    if (VVar4 != VERSION_100) {
      name = pcVar16;
    }
    pVVar10 = VariableManager::allocate
                        (this->m_state->m_varManager,(VariableType *)local_1d8,STORAGE_SHADER_OUT,
                         name);
    VariableType::~VariableType((VariableType *)local_1d8);
    ValueRange::ValueRange((ValueRange *)local_1d8,&pVVar10->m_type);
    local_2b8.m_line._M_dataplus._M_p = (pointer)0x0;
    local_2b8.m_line._M_string_length = 0;
    pSVar19 = (Scalar *)0x0;
    pSVar17 = local_188;
    if (local_188 == local_180) {
      pSVar17 = pSVar19;
    }
    do {
      SVar3 = *(Scalar *)((long)&local_2b8.m_line._M_dataplus._M_p + (long)pSVar19 * 4);
      VariableType::getElementType((VariableType *)local_1d8);
      pSVar17[(long)pSVar19] = SVar3;
      pSVar19 = (Scalar *)((long)pSVar19 + 1);
    } while (pSVar19 != (Scalar *)0x4);
    local_2b8.m_line._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    local_2b8.m_line._M_string_length = 0x3f8000003f800000;
    pSVar19 = (Scalar *)0x0;
    pSVar17 = local_170;
    if (local_170 == local_168[0]) {
      pSVar17 = pSVar19;
    }
    do {
      SVar3 = *(Scalar *)((long)&local_2b8.m_line._M_dataplus._M_p + (long)pSVar19 * 4);
      VariableType::getElementType((VariableType *)local_1d8);
      pSVar17[(long)pSVar19] = SVar3;
      pSVar19 = (Scalar *)((long)pSVar19 + 1);
    } while (pSVar19 != (Scalar *)0x4);
    pVVar10->m_layoutLocation = 0;
    pSStack_1e8 = local_188;
    if (local_188 == local_180) {
      pSStack_1e8 = (Scalar *)0x0;
    }
    local_1e0 = local_170;
    if (local_170 == local_168[0]) {
      local_1e0 = (Scalar *)0x0;
    }
    value_00.m_min = pSStack_1e8;
    value_00.m_type = (VariableType *)local_1d8;
    value_00.m_max = local_1e0;
    local_1f0 = (VariableType *)local_1d8;
    VariableManager::setValue(this->m_state->m_varManager,pVVar10,value_00);
    ValueRange::~ValueRange((ValueRange *)local_1d8);
  }
  local_1d8._8_8_ = &local_1c0;
  local_1d8._0_8_ = (GeneratorState *)0x0;
  local_1d8._16_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_1c0._M_local_buf[0] = '\0';
  local_1b0 = 0;
  local_1a8 = (VariableType *)0x0;
  pMStack_1a0 = (pointer)0x0;
  local_198 = (pointer)0x0;
  pMStack_190 = (pointer)0x0;
  VariableType::operator=(&(shader->m_mainFunction).m_returnType,(VariableType *)local_1d8);
  VariableType::~VariableType((VariableType *)local_1d8);
  if (shaderParams->randomize == true) {
    FunctionGenerator::FunctionGenerator
              ((FunctionGenerator *)local_1d8,this->m_state,&shader->m_mainFunction);
    ppVVar20 = (shader->m_globalScope).m_liveVariables.
               super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppVVar20 !=
        (shader->m_globalScope).m_liveVariables.
        super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        if ((*ppVVar20)->m_storage == STORAGE_SHADER_OUT) {
          FunctionGenerator::requireAssignment((FunctionGenerator *)local_1d8,*ppVVar20);
        }
        ppVVar20 = ppVVar20 + 1;
      } while (ppVVar20 !=
               (shader->m_globalScope).m_liveVariables.
               super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    FunctionGenerator::generate((FunctionGenerator *)local_1d8);
    FunctionGenerator::~FunctionGenerator((FunctionGenerator *)local_1d8);
  }
  else {
    pGVar24 = this->m_state;
    if (shader->m_type == TYPE_VERTEX) {
      local_2b8.m_line._M_dataplus._M_p = (pointer)0x0;
      local_2b8.m_line._M_string_length = 0;
      local_2b8.m_line.field_2._M_allocated_capacity = 0;
      ppVVar22 = (pGVar24->m_varManager->m_entryCache).
                 super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVVar5 = (pGVar24->m_varManager->m_entryCache).
                super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVVar22 != ppVVar5) {
        __position_00._M_current = (ValueEntry **)0x0;
        do {
          iVar11 = std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::
                   insert((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                           *)&local_2b8,__position_00,ppVVar22);
          __position_00._M_current = iVar11._M_current + 1;
          ppVVar22 = ppVVar22 + 1;
        } while (ppVVar22 != ppVVar5);
      }
      if (local_2b8.m_line._M_dataplus._M_p != (pointer)local_2b8.m_line._M_string_length) {
        pGVar2 = (GeneratorState *)(local_1d8 + 0x10);
        _Var18._M_p = local_2b8.m_line._M_dataplus._M_p;
        do {
          puVar6 = *(undefined8 **)_Var18._M_p;
          type = (VariableType *)*puVar6;
          local_1d8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_1d8._16_8_ = local_1d8._16_8_ & 0xffffffffffffff00;
          local_1d8._0_8_ = pGVar2;
          if (type[1].m_baseType == TYPE_INT) {
            std::__cxx11::string::_M_replace((ulong)local_1d8,0,(char *)0x0,0x17130f);
            deStringBeginsWith(type[1].m_typeName._M_dataplus._M_p,"v_");
            std::__cxx11::string::append(local_1d8);
            pVVar10 = VariableManager::allocate
                                (pGVar24->m_varManager,type,STORAGE_SHADER_IN,
                                 (char *)local_1d8._0_8_);
            local_280.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)puVar6[0xb];
            local_280.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)puVar6[0xe];
            if (local_280.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                _M_impl.super__Vector_impl_data._M_finish == (pointer)puVar6[0xc]) {
              local_280.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)0x0;
            }
            if ((Scalar *)
                local_280.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage == (Scalar *)puVar6[0xf]) {
              local_280.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            }
            local_280.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)(puVar6 + 1);
            value_02.m_min =
                 (Scalar *)
                 local_280.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            value_02.m_type =
                 (VariableType *)
                 local_280.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            value_02.m_max =
                 (Scalar *)
                 local_280.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            VariableManager::setValue(pGVar24->m_varManager,pVVar10,value_02);
            anon_unknown_27::createAssignment
                      (&(shader->m_mainFunction).m_functionBlock,(Variable *)*puVar6,pVVar10);
          }
          if ((GeneratorState *)local_1d8._0_8_ != pGVar2) {
            operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
          }
          _Var18._M_p = _Var18._M_p + 8;
        } while (_Var18._M_p != (pointer)local_2b8.m_line._M_string_length);
      }
      if ((long *)local_2b8.m_line._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_2b8.m_line._M_dataplus._M_p,
                        local_2b8.m_line.field_2._M_allocated_capacity -
                        (long)local_2b8.m_line._M_dataplus._M_p);
      }
    }
    else {
      VVar4 = pGVar24->m_programParams->version;
      pVVar13 = (ValueEntry *)0x0;
      pVVar15 = (ValueEntry *)"dEQP_FragColor";
      if (VVar4 != VERSION_300) {
        pVVar15 = pVVar13;
      }
      b = (ValueEntry *)"gl_FragColor";
      if (VVar4 != VERSION_100) {
        b = pVVar15;
      }
      ppVVar22 = (pGVar24->m_varManager->m_entryCache).
                 super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVVar5 = (pGVar24->m_varManager->m_entryCache).
                super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVVar22 != ppVVar5) {
        do {
          pVVar13 = *ppVVar22;
          dVar9 = deStringEqual((pVVar13->m_variable->m_name)._M_dataplus._M_p,(char *)b);
          if (dVar9 != 0) goto LAB_00132eca;
          ppVVar22 = ppVVar22 + 1;
        } while (ppVVar22 != ppVVar5);
        pVVar13 = (ValueEntry *)0x0;
      }
LAB_00132eca:
      if (pVVar13 == (ValueEntry *)0x0) {
        this_03 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_03,(char *)0x0,"fragColorEntry",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgShaderGenerator.cpp"
                   ,0x80);
        __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      pVVar10 = VariableManager::allocate
                          (pGVar24->m_varManager,&pVVar13->m_variable->m_type,STORAGE_SHADER_IN,
                           "v_color");
      local_1d8._8_8_ =
           (pVVar13->m_valueRange).m_min.
           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_1d8._16_8_ =
           (pVVar13->m_valueRange).m_max.
           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._8_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(pVVar13->m_valueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        local_1d8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._16_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(pVVar13->m_valueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        local_1d8._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
      }
      local_1d8._0_8_ = &pVVar13->m_valueRange;
      value_01.m_min = (Scalar *)local_1d8._8_8_;
      value_01.m_type = (VariableType *)local_1d8._0_8_;
      value_01.m_max = (Scalar *)local_1d8._16_8_;
      VariableManager::setValue(pGVar24->m_varManager,pVVar10,value_01);
      anon_unknown_27::createAssignment
                (&(shader->m_mainFunction).m_functionBlock,pVVar13->m_variable,pVVar10);
    }
  }
  if (shader->m_type == TYPE_VERTEX) {
    VariableManager::release(this->m_state->m_varManager,&local_284);
    local_1d8._0_8_ = (GeneratorState *)0x1;
    local_1d8._16_8_ = (pointer)0x0;
    local_1c0._M_local_buf[0] = '\0';
    local_1b0 = 4;
    local_1a8 = (VariableType *)0x0;
    pMStack_1a0 = (pointer)0x0;
    local_198 = (pointer)0x0;
    pMStack_190 = (pointer)0x0;
    local_1d8._8_8_ = &local_1c0;
    pVVar10 = VariableManager::allocate
                        (this->m_state->m_varManager,(VariableType *)local_1d8,STORAGE_SHADER_OUT,
                         "gl_Position");
    VariableType::~VariableType((VariableType *)local_1d8);
    local_1d8._0_8_ = (GeneratorState *)0x1;
    local_1d8._16_8_ = (pointer)0x0;
    local_1c0._M_local_buf[0] = '\0';
    local_1b0 = 4;
    local_1a8 = (VariableType *)0x0;
    pMStack_1a0 = (pointer)0x0;
    local_198 = (pointer)0x0;
    pMStack_190 = (pointer)0x0;
    local_1d8._8_8_ = &local_1c0;
    variable_00 = VariableManager::allocate
                            (this->m_state->m_varManager,(VariableType *)local_1d8,STORAGE_SHADER_IN
                             ,"dEQP_Position");
    VariableType::~VariableType((VariableType *)local_1d8);
    ValueRange::ValueRange((ValueRange *)local_1d8,&pVVar10->m_type);
    local_2b8.m_line._M_dataplus._M_p = (pointer)0xbf800000bf800000;
    local_2b8.m_line._M_string_length = 0x3f80000000000000;
    pSVar19 = (Scalar *)0x0;
    pSVar17 = local_188;
    if (local_188 == local_180) {
      pSVar17 = pSVar19;
    }
    do {
      SVar3 = *(Scalar *)((long)&local_2b8.m_line._M_dataplus._M_p + (long)pSVar19 * 4);
      VariableType::getElementType((VariableType *)local_1d8);
      pSVar17[(long)pSVar19] = SVar3;
      pSVar19 = (Scalar *)((long)pSVar19 + 1);
    } while (pSVar19 != (Scalar *)0x4);
    local_2b8.m_line._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    local_2b8.m_line._M_string_length = 0x3f80000000000000;
    pSVar19 = (Scalar *)0x0;
    pSVar17 = local_170;
    if (local_170 == local_168[0]) {
      pSVar17 = pSVar19;
    }
    do {
      SVar3 = *(Scalar *)((long)&local_2b8.m_line._M_dataplus._M_p + (long)pSVar19 * 4);
      VariableType::getElementType((VariableType *)local_1d8);
      pSVar17[(long)pSVar19] = SVar3;
      pSVar19 = (Scalar *)((long)pSVar19 + 1);
    } while (pSVar19 != (Scalar *)0x4);
    pSStack_200 = local_188;
    if (local_188 == local_180) {
      pSStack_200 = (Scalar *)0x0;
    }
    local_1f8 = local_170;
    if (local_170 == local_168[0]) {
      local_1f8 = (Scalar *)0x0;
    }
    value_03.m_min = pSStack_200;
    value_03.m_type = (VariableType *)local_1d8;
    value_03.m_max = local_1f8;
    local_208 = (VariableType *)local_1d8;
    VariableManager::setValue(this->m_state->m_varManager,variable_00,value_03);
    anon_unknown_27::createAssignment(&(shader->m_mainFunction).m_functionBlock,pVVar10,variable_00)
    ;
    ValueRange::~ValueRange((ValueRange *)local_1d8);
  }
  local_1d8._0_8_ = (GeneratorState *)0x0;
  local_1d8._8_8_ = (pointer)0x0;
  local_1d8._16_8_ = (pointer)0x0;
  ppVVar20 = (shader->m_globalScope).m_liveVariables.
             super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  lVar23 = (long)(shader->m_globalScope).m_liveVariables.
                 super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)ppVVar20 >> 3;
  if (0 < lVar23) {
    lVar23 = lVar23 + 1;
    __position_01._M_current = (Variable **)0x0;
    do {
      iVar12 = std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::insert
                         ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)local_1d8,
                          __position_01,ppVVar20);
      __position_01._M_current = iVar12._M_current + 1;
      ppVVar20 = ppVVar20 + 1;
      lVar23 = lVar23 + -1;
    } while (1 < lVar23);
  }
  local_2b8.m_line._M_dataplus._M_p = (pointer)0x0;
  local_2b8.m_line._M_string_length = 0;
  local_2b8.m_line.field_2._M_allocated_capacity = 0;
  if (local_1d8._0_8_ != local_1d8._8_8_) {
    pGVar24 = (GeneratorState *)local_1d8._0_8_;
    do {
      local_280.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pGVar24->m_programParams;
      dVar9 = deStringBeginsWith((((Variable *)
                                  local_280.m_tokens.
                                  super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->m_name)._M_dataplus.
                                 _M_p,"gl_");
      if (*(Storage *)
           ((long)local_280.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start + 0x50) == STORAGE_SHADER_IN) {
        pVVar13 = VariableManager::getValue
                            (this->m_state->m_varManager,
                             (Variable *)
                             local_280.m_tokens.
                             super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                             super__Vector_impl_data._M_start);
        std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::reserve
                  (&shader->m_inputs,
                   ((long)(shader->m_inputs).
                          super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(shader->m_inputs).
                          super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
        pSVar14 = (ShaderInput *)operator_new(0x38);
        local_250.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&pVVar13->m_valueRange;
        pSStack_218 = (pVVar13->m_valueRange).m_min.
                      super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_210 = (pVVar13->m_valueRange).m_max.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_start;
        if (pSStack_218 ==
            (pVVar13->m_valueRange).m_min.
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pSStack_218 = (pointer)0x0;
        }
        if (local_210 ==
            (pVVar13->m_valueRange).m_max.
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_210 = (Scalar *)0x0;
        }
        valueRange_01.m_min = pSStack_218;
        valueRange_01.m_type =
             (VariableType *)
             local_250.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        valueRange_01.m_max = local_210;
        ShaderInput::ShaderInput
                  (pSVar14,(Variable *)
                           local_280.m_tokens.
                           super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                           super__Vector_impl_data._M_start,valueRange_01);
        local_260[0] = pSVar14;
        std::vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>>::
        emplace_back<rsg::ShaderInput*>
                  ((vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>> *)&shader->m_inputs,
                   local_260);
      }
      else if (*(Storage *)
                ((long)local_280.m_tokens.
                       super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                       super__Vector_impl_data._M_start + 0x50) == STORAGE_UNIFORM) {
        pVVar13 = VariableManager::getValue
                            (this->m_state->m_varManager,
                             (Variable *)
                             local_280.m_tokens.
                             super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                             super__Vector_impl_data._M_start);
        std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::reserve
                  (&shader->m_uniforms,
                   ((long)(shader->m_uniforms).
                          super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(shader->m_uniforms).
                          super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
        pSVar14 = (ShaderInput *)operator_new(0x38);
        local_250.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&pVVar13->m_valueRange;
        local_250.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pVVar13->m_valueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_250.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pVVar13->m_valueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
        if (local_250.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (pVVar13->m_valueRange).m_min.
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_250.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
        }
        if (local_250.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (pVVar13->m_valueRange).m_max.
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_250.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish = (Scalar *)0x0;
        }
        valueRange_00.m_min =
             local_250.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
        valueRange_00.m_type =
             (VariableType *)
             local_250.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        valueRange_00.m_max =
             local_250.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
        ShaderInput::ShaderInput
                  (pSVar14,(Variable *)
                           local_280.m_tokens.
                           super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                           super__Vector_impl_data._M_start,valueRange_00);
        local_260[0] = pSVar14;
        std::vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>>::
        emplace_back<rsg::ShaderInput*>
                  ((vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>> *)
                   &shader->m_uniforms,local_260);
      }
      if (dVar9 == 0) {
        if (local_2b8.m_line._M_string_length == local_2b8.m_line.field_2._M_allocated_capacity) {
          std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>::
          _M_realloc_insert<rsg::Variable*const&>
                    ((vector<rsg::Variable*,std::allocator<rsg::Variable*>> *)&local_2b8,
                     (iterator)local_2b8.m_line._M_string_length,(Variable **)&local_280);
        }
        else {
          *(pointer *)local_2b8.m_line._M_string_length =
               local_280.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_2b8.m_line._M_string_length = local_2b8.m_line._M_string_length + 8;
        }
      }
      else {
        VariableManager::declareVariable
                  (this->m_state->m_varManager,
                   (Variable *)
                   local_280.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start);
      }
      pGVar24 = (GeneratorState *)&pGVar24->m_random;
    } while (pGVar24 != (GeneratorState *)local_1d8._8_8_);
  }
  pGVar24 = this->m_state;
  local_280.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_280.m_tokens.
                         super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,3);
  __position._M_current =
       (pGVar24->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pGVar24->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pGVar24->m_exprFlagStack,
               __position,(uint *)&local_280);
  }
  else {
    *__position._M_current = 3;
    (pGVar24->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  if (local_2b8.m_line._M_dataplus._M_p != (pointer)local_2b8.m_line._M_string_length) {
    _Var18._M_p = local_2b8.m_line._M_dataplus._M_p;
    do {
      std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::reserve
                (&shader->m_globalStatements,
                 (long)(shader->m_globalStatements).
                       super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(shader->m_globalStatements).
                       super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
      this_02 = (DeclarationStatement *)operator_new(0x18);
      DeclarationStatement::DeclarationStatement(this_02,this->m_state,*(Variable **)_Var18._M_p);
      local_280.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)this_02;
      std::vector<rsg::Statement*,std::allocator<rsg::Statement*>>::emplace_back<rsg::Statement*>
                ((vector<rsg::Statement*,std::allocator<rsg::Statement*>> *)
                 &shader->m_globalStatements,(Statement **)&local_280);
      _Var18._M_p = _Var18._M_p + 8;
    } while (_Var18._M_p != (pointer)local_2b8.m_line._M_string_length);
  }
  ppuVar1 = &(this->m_state->m_exprFlagStack).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.m_line._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_2b8.m_line._M_dataplus._M_p,
                    local_2b8.m_line.field_2._M_allocated_capacity -
                    (long)local_2b8.m_line._M_dataplus._M_p);
  }
  this_01 = local_250.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((GeneratorState *)local_1d8._0_8_ != (GeneratorState *)0x0) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ - local_1d8._0_8_);
  }
  VariableManager::popVariableScope((VariableManager *)this_01);
  VariableManager::popValueScope((VariableManager *)this_01);
  anon_unknown_27::fillUndefinedShaderInputs(&shader->m_inputs);
  anon_unknown_27::fillUndefinedShaderInputs(&shader->m_uniforms);
  TokenStream::TokenStream(&local_280);
  Shader::tokenize(shader,this->m_state,&local_280);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  PrettyPrinter::PrettyPrinter(&local_2b8,(ostringstream *)local_1d8);
  if (this->m_state->m_programParams->version == VERSION_300) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"#version 300 es\n",0x10);
  }
  PrettyPrinter::append(&local_2b8,&local_280);
  std::__cxx11::stringbuf::str();
  pSVar14 = local_260[0];
  pcVar16 = (char *)(shader->m_source)._M_string_length;
  strlen((char *)local_260[0]);
  std::__cxx11::string::_M_replace((ulong)&shader->m_source,0,pcVar16,(ulong)pSVar14);
  if (local_260[0] != &local_250) {
    operator_delete(local_260[0],(ulong)((long)&((local_250.m_variable)->m_type).m_baseType + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.m_line._M_dataplus._M_p != &local_2b8.m_line.field_2) {
    operator_delete(local_2b8.m_line._M_dataplus._M_p,
                    local_2b8.m_line.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  std::ios_base::~ios_base((ios_base *)local_168);
  TokenStream::~TokenStream(&local_280);
  ValueScope::~ValueScope(&local_48);
  return;
}

Assistant:

void ShaderGenerator::generate (const ShaderParameters& shaderParams, Shader& shader, const vector<ShaderInput*>& outputs)
{
	// Global scopes
	VariableScope&	globalVariableScope	= shader.getGlobalScope();
	ValueScope		globalValueScope;

	// Init state
	m_state.setShader(shaderParams, shader);
	DE_ASSERT(m_state.getExpressionFlags() == 0);

	// Reserve some scalars for gl_Position & dEQP_Position
	ReservedScalars reservedScalars;
	if (shader.getType() == Shader::TYPE_VERTEX)
		m_state.getVariableManager().reserve(reservedScalars, 4*2);

	// Push global scopes
	m_varManager.pushVariableScope(globalVariableScope);
	m_varManager.pushValueScope(globalValueScope);

	// Init shader outputs.
	{
		for (vector<ShaderInput*>::const_iterator i = outputs.begin(); i != outputs.end(); i++)
		{
			const ShaderInput*	input		= *i;
			Variable*			variable	= m_state.getVariableManager().allocate(input->getVariable()->getType(), Variable::STORAGE_SHADER_OUT, input->getVariable()->getName());

			m_state.getVariableManager().setValue(variable, input->getValueRange());
		}

		if (shader.getType() == Shader::TYPE_FRAGMENT)
		{
			// gl_FragColor
			// \todo [2011-11-22 pyry] Multiple outputs from fragment shader!
			Variable*	fragColorVar	= m_state.getVariableManager().allocate(VariableType(VariableType::TYPE_FLOAT, 4), Variable::STORAGE_SHADER_OUT, getFragColorName(m_state));
			ValueRange	valueRange(fragColorVar->getType());

			valueRange.getMin() = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
			valueRange.getMax() = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);

			fragColorVar->setLayoutLocation(0); // Bind color output to location 0 (applies to GLSL ES 3.0 onwards).

			m_state.getVariableManager().setValue(fragColorVar, valueRange.asAccess());
		}
	}

	// Construct shader code.
	{
		Function& main = shader.getMain();
		main.setReturnType(VariableType(VariableType::TYPE_VOID));

		if (shaderParams.randomize)
		{
			FunctionGenerator funcGen(m_state, main);

			// Mandate assignment into to all shader outputs in main()
			const vector<Variable*>& liveVars = globalVariableScope.getLiveVariables();
			for (vector<Variable*>::const_iterator i = liveVars.begin(); i != liveVars.end(); i++)
			{
				Variable* variable = *i;
				if (variable->getStorage() == Variable::STORAGE_SHADER_OUT)
					funcGen.requireAssignment(variable);
			}

			funcGen.generate();
		}
		else
		{
			if (shader.getType() == Shader::TYPE_VERTEX)
				genVertexPassthrough(m_state, shader);
			else
			{
				DE_ASSERT(shader.getType() == Shader::TYPE_FRAGMENT);
				genFragmentPassthrough(m_state, shader);
			}
		}

		if (shader.getType() == Shader::TYPE_VERTEX)
		{
			// Add gl_Position = dEQP_Position;
			m_state.getVariableManager().release(reservedScalars);

			Variable* glPosVariable = m_state.getVariableManager().allocate(VariableType(VariableType::TYPE_FLOAT, 4), Variable::STORAGE_SHADER_OUT, "gl_Position");
			Variable* qpPosVariable = m_state.getVariableManager().allocate(VariableType(VariableType::TYPE_FLOAT, 4), Variable::STORAGE_SHADER_IN, "dEQP_Position");

			ValueRange valueRange(glPosVariable->getType());

			valueRange.getMin() = tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f);
			valueRange.getMax() = tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f);

			m_state.getVariableManager().setValue(qpPosVariable, valueRange.asAccess()); // \todo [2011-05-24 pyry] No expression should be able to use gl_Position or dEQP_Position..

			createAssignment(main.getBody(), glPosVariable, qpPosVariable);
		}
	}

	// Declare live global variables.
	{
		vector<Variable*> liveVariables;
		std::copy(globalVariableScope.getLiveVariables().begin(), globalVariableScope.getLiveVariables().end(), std::inserter(liveVariables, liveVariables.begin()));

		vector<Variable*> createDeclarationStatementVars;

		for (vector<Variable*>::iterator i = liveVariables.begin(); i != liveVariables.end(); i++)
		{
			Variable*		variable	= *i;
			const char*		name		= variable->getName();
			bool			declare		= !deStringBeginsWith(name, "gl_"); // Do not declare built-in types.

			// Create input entries (store value range) if necessary
			vector<ShaderInput*>& inputs	= shader.getInputs();
			vector<ShaderInput*>& uniforms	= shader.getUniforms();

			switch (variable->getStorage())
			{
				case Variable::STORAGE_SHADER_IN:
				{
					const ValueEntry* value = m_state.getVariableManager().getValue(variable);

					inputs.reserve(inputs.size()+1);
					inputs.push_back(new ShaderInput(variable, value->getValueRange()));
					break;
				}

				case Variable::STORAGE_UNIFORM:
				{
					const ValueEntry* value = m_state.getVariableManager().getValue(variable);

					uniforms.reserve(uniforms.size()+1);
					uniforms.push_back(new ShaderInput(variable, value->getValueRange()));
					break;
				}

				default:
					break;
			}

			if (declare)
				createDeclarationStatementVars.push_back(variable);
			else
			{
				// Just move to global scope without declaration statement.
				m_state.getVariableManager().declareVariable(variable);
			}
		}

		// All global initializers must be constant expressions, no variable allocation is allowed
		DE_ASSERT(m_state.getExpressionFlags() == 0);
		m_state.pushExpressionFlags(CONST_EXPR|NO_VAR_ALLOCATION);

		// Create declaration statements
		for (vector<Variable*>::iterator i = createDeclarationStatementVars.begin(); i != createDeclarationStatementVars.end(); i++)
		{
			shader.getGlobalStatements().reserve(shader.getGlobalStatements().size());
			shader.getGlobalStatements().push_back(new DeclarationStatement(m_state, *i));
		}

		m_state.popExpressionFlags();
	}

	// Pop global scopes
	m_varManager.popVariableScope();
	m_varManager.popValueScope();

	// Fill undefined (unused) components in inputs with dummy values
	fillUndefinedShaderInputs(shader.getInputs());
	fillUndefinedShaderInputs(shader.getUniforms());

	// Tokenize shader and write source
	{
		TokenStream tokenStr;
		shader.tokenize(m_state, tokenStr);

		std::ostringstream	str;
		PrettyPrinter		printer(str);

		// Append #version if necessary.
		if (m_state.getProgramParameters().version == VERSION_300)
			str << "#version 300 es\n";

		printer.append(tokenStr);
		shader.setSource(str.str().c_str());
	}
}